

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

void lws_dump_header(lws *wsi,int hdr)

{
  uint uVar1;
  uchar *local_100;
  int len;
  uchar *p;
  char s [200];
  int hdr_local;
  lws *wsi_local;
  
  if (hdr == 0xffff) {
    _lws_log(4,"hdr tok ignored\n");
  }
  else {
    uVar1 = lws_hdr_copy(wsi,(char *)&p,199,hdr);
    if ((int)uVar1 < 0) {
      strcpy((char *)&p,"(too big to show)");
    }
    else {
      s[(long)(int)uVar1 + -8] = '\0';
    }
    local_100 = lws_token_to_string(hdr);
    if (local_100 == (uchar *)0x0) {
      local_100 = "null";
    }
    _lws_log(0x40,"  hdr tok %d (%s) = \'%s\' (len %d)\n",(ulong)(uint)hdr,local_100,&p,(ulong)uVar1
            );
  }
  return;
}

Assistant:

static void lws_dump_header(struct lws *wsi, int hdr)
{
	char s[200];
	const unsigned char *p;
	int len;

	if (hdr == LWS_HPACK_IGNORE_ENTRY) {
		lwsl_notice("hdr tok ignored\n");
		return;
	}

	(void)p;

	len = lws_hdr_copy(wsi, s, sizeof(s) - 1, (enum lws_token_indexes)hdr);
	if (len < 0)
		strcpy(s, "(too big to show)");
	else
		s[len] = '\0';
#if defined(_DEBUG)
	p = lws_token_to_string((enum lws_token_indexes)hdr);
	lwsl_header("  hdr tok %d (%s) = '%s' (len %d)\n", hdr,
		   p ? (char *)p : (char *)"null", s, len);
#endif
}